

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

int32_t __thiscall
helics::HandleManager::getHandleOption(HandleManager *this,InterfaceHandle handle,int32_t option)

{
  bool bVar1;
  const_reference pvVar2;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *this_00;
  int in_EDX;
  bool rvalue;
  BaseType index;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
  *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int testSize;
  bool local_19;
  InterfaceHandle local_4;
  
  testSize = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  InterfaceHandle::baseValue(&local_4);
  local_19 = false;
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    (testSize,in_stack_ffffffffffffffc8);
  if (!bVar1) goto LAB_0062e5cc;
  this_00 = (deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
            (ulong)(in_EDX - 0x18dU);
  if (in_EDX - 0x18dU < 0x39 || in_EDX == 0x1c6) {
    switch((long)&switchD_0062e4c1::switchdataD_00813910 +
           (long)(int)(&switchD_0062e4c1::switchdataD_00813910)[(long)this_00]) {
    case 0x62e4c3:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      local_19 = checkActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>
                           ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                             *)pvVar2,only_update_on_change_flag);
      break;
    case 0x62e4ea:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      local_19 = checkActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>
                           ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                             *)pvVar2,only_transmit_on_change_flag);
      break;
    case 0x62e511:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      local_19 = checkActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>
                           ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                             *)pvVar2,required_flag);
      break;
    case 0x62e538:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      local_19 = checkActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>
                           ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                             *)pvVar2,optional_flag);
      break;
    case 0x62e55c:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      local_19 = checkActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>
                           ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                             *)pvVar2,single_connection_flag);
      break;
    case 0x62e580:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      local_19 = checkActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>
                           ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                             *)pvVar2,reconnectable_flag);
      break;
    case 0x62e5a4:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      local_19 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>
                           ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                             *)pvVar2,receive_only_flag);
      break;
    case 0x62e5c8:
      goto switchD_0062e4c1_caseD_62e5c8;
    }
  }
  else {
switchD_0062e4c1_caseD_62e5c8:
  }
LAB_0062e5cc:
  return (uint)(local_19 != false);
}

Assistant:

int32_t HandleManager::getHandleOption(InterfaceHandle handle, int32_t option) const
{
    auto index = handle.baseValue();
    bool rvalue{false};
    if (isValidIndex(index, handles)) {
        switch (option) {
            case HELICS_HANDLE_OPTION_ONLY_UPDATE_ON_CHANGE:
                rvalue = checkActionFlag(handles[index], only_update_on_change_flag);
                break;
            case HELICS_HANDLE_OPTION_ONLY_TRANSMIT_ON_CHANGE:
                rvalue = checkActionFlag(handles[index], only_transmit_on_change_flag);
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_REQUIRED:
                rvalue = checkActionFlag(handles[index], required_flag);
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_OPTIONAL:
                rvalue = checkActionFlag(handles[index], optional_flag);
                break;
            case HELICS_HANDLE_OPTION_SINGLE_CONNECTION_ONLY:
                rvalue = checkActionFlag(handles[index], single_connection_flag);
                break;
            case HELICS_HANDLE_OPTION_RECONNECTABLE:
                rvalue = checkActionFlag(handles[index], reconnectable_flag);
                break;
            case HELICS_HANDLE_OPTION_RECEIVE_ONLY:
                rvalue = checkActionFlag(handles[index], receive_only_flag);
                break;
            default:
                break;
        }
    }
    return rvalue ? 1 : 0;
}